

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_4::Validator::OnCatchExpr(Validator *this,TryExpr *param_1,Catch *catch_)

{
  bool is_catch_all;
  Result RVar1;
  Var VStack_68;
  
  Var::Var(&VStack_68,&catch_->var);
  is_catch_all = Catch::IsCatchAll(catch_);
  RVar1 = SharedValidator::OnCatch(&this->validator_,&catch_->loc,&VStack_68,is_catch_all);
  (this->result_).enum_ = (uint)(RVar1.enum_ == Error || (this->result_).enum_ == Error);
  Var::~Var(&VStack_68);
  return (Result)Ok;
}

Assistant:

Result Validator::OnCatchExpr(TryExpr*, Catch* catch_) {
  result_ |= validator_.OnCatch(catch_->loc, catch_->var, catch_->IsCatchAll());
  return Result::Ok;
}